

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

int get_br_cost_with_diff(tran_low_t level,int *coeff_lps,int *diff)

{
  uint uVar1;
  int iVar2;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  int r;
  int golomb_bits;
  int base_range;
  int local_28;
  int iVar3;
  
  if (in_EDI + -3 < 0xc) {
    local_28 = in_EDI + -3;
  }
  else {
    local_28 = 0xc;
  }
  iVar3 = 0;
  if (in_EDI < 0x10) {
    *in_RDX = *(int *)(in_RSI + (long)(local_28 + 0xd) * 4) + *in_RDX;
  }
  if (0xe < in_EDI) {
    uVar1 = in_EDI - 0xe;
    if ((int)uVar1 < 0x20) {
      iVar3 = golomb_bits_cost[(int)uVar1];
      *in_RDX = golomb_cost_diff[(int)uVar1] + *in_RDX;
    }
    else {
      iVar3 = get_golomb_cost(0);
      iVar2 = 0;
      if ((uVar1 & in_EDI - 0xfU) == 0) {
        iVar2 = 0x400;
      }
      *in_RDX = iVar2 + *in_RDX;
    }
  }
  return *(int *)(in_RSI + (long)local_28 * 4) + iVar3;
}

Assistant:

static inline int get_br_cost_with_diff(tran_low_t level, const int *coeff_lps,
                                        int *diff) {
  const int base_range = AOMMIN(level - 1 - NUM_BASE_LEVELS, COEFF_BASE_RANGE);
  int golomb_bits = 0;
  if (level <= COEFF_BASE_RANGE + 1 + NUM_BASE_LEVELS)
    *diff += coeff_lps[base_range + COEFF_BASE_RANGE + 1];

  if (level >= COEFF_BASE_RANGE + 1 + NUM_BASE_LEVELS) {
    int r = level - COEFF_BASE_RANGE - NUM_BASE_LEVELS;
    if (r < 32) {
      golomb_bits = golomb_bits_cost[r];
      *diff += golomb_cost_diff[r];
    } else {
      golomb_bits = get_golomb_cost(level);
      *diff += (r & (r - 1)) == 0 ? 1024 : 0;
    }
  }

  return coeff_lps[base_range] + golomb_bits;
}